

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O2

bool __thiscall wirehair::Codec::TriangleNonHeavy(Codec *this)

{
  ulong *puVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint64_t *puVar6;
  uint16_t *puVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  
  uVar3 = this->_pivot_count;
  uVar4 = this->_first_heavy_column;
  uVar14 = (ulong)this->_next_pivot;
  puVar6 = this->_ge_matrix;
  uVar11 = 1L << (uVar14 & 0x3f);
  do {
    if (uVar4 <= uVar14) {
      this->_next_pivot = (uint)uVar14;
      InsertHeavyRows(this);
LAB_001039d9:
      return uVar4 <= uVar14;
    }
    uVar5 = this->_ge_pitch;
    puVar7 = this->_pivots;
    uVar10 = uVar14 >> 6 & 0x3ffffff;
    iVar9 = (int)uVar10;
    uVar16 = uVar14 & 0xffffffff;
    do {
      uVar15 = uVar16;
      if (uVar3 <= (uint)uVar15) {
        this->_next_pivot = (uint)uVar14;
        goto LAB_001039d9;
      }
      uVar2 = puVar7[uVar15];
      uVar12 = (ulong)(uVar2 * uVar5);
      uVar8 = puVar6[uVar10 + uVar12];
      uVar16 = uVar15 + 1;
    } while ((uVar8 & uVar11) == 0);
    puVar7[uVar15] = puVar7[uVar14];
    puVar7[uVar14] = uVar2;
    while (uVar16 = uVar15 + 1, uVar16 < uVar3) {
      uVar13 = (ulong)(puVar7[uVar15 + 1] * uVar5);
      uVar15 = uVar16;
      if ((puVar6[uVar10 + uVar13] & uVar11) != 0) {
        puVar6[uVar10 + uVar13] = puVar6[uVar10 + uVar13] ^ uVar8 & -uVar11 ^ uVar11;
        for (uVar16 = 1; uVar16 < uVar5 - iVar9; uVar16 = uVar16 + 1) {
          puVar1 = (ulong *)((long)puVar6 + uVar16 * 8 + uVar13 * 8 + (ulong)(uint)(iVar9 * 8));
          *puVar1 = *puVar1 ^ *(ulong *)((long)puVar6 +
                                        uVar16 * 8 + uVar12 * 8 + (ulong)(uint)(iVar9 * 8));
        }
      }
    }
    uVar11 = uVar11 >> 0x3f | uVar11 << 1;
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

bool Codec::TriangleNonHeavy()
{
    CAT_IF_DUMP(cout << endl << "---- TriangleNonHeavy ----" << endl << endl;)

    const unsigned pivot_count = _pivot_count;
    const unsigned first_heavy_column = _first_heavy_column;

    unsigned pivot_i = _next_pivot;
    uint64_t ge_mask = (uint64_t)1 << (pivot_i & 63);

    // For the columns that are not protected by heavy rows:
    for (; pivot_i < first_heavy_column; ++pivot_i)
    {
        const unsigned word_offset = pivot_i >> 6;

        bool found = false;

        uint64_t * GF256_RESTRICT ge_matrix_offset = _ge_matrix + word_offset;

        // For each remaining GE row that might be the pivot:
        for (unsigned pivot_j = pivot_i; pivot_j < pivot_count; ++pivot_j)
        {
            // Determine if the row contains the bit we want
            const unsigned ge_row_j = _pivots[pivot_j];

            uint64_t * GF256_RESTRICT ge_row = &ge_matrix_offset[_ge_pitch * ge_row_j];

            // If the bit was not found:
            if (0 == (*ge_row & ge_mask)) {
                continue; // Skip to next
            }

            // Found it!
            found = true;

            CAT_IF_DUMP(cout << "Pivot " << pivot_i << " found on row " << ge_row_j << endl;)

            // Swap out the pivot index for this one
            _pivots[pivot_j] = _pivots[pivot_i];
            CAT_DEBUG_ASSERT(ge_row_j < _pivot_count);
            _pivots[pivot_i] = (uint16_t)ge_row_j;

            // Prepare masked first word
            const uint64_t row0 = (*ge_row & ~(ge_mask - 1)) ^ ge_mask;

            // For each remaining unused row:
            for (unsigned pivot_k = pivot_j + 1; pivot_k < pivot_count; ++pivot_k)
            {
                // Determine if the row contains the bit we want
                const unsigned ge_row_k = _pivots[pivot_k];

                uint64_t * GF256_RESTRICT rem_row = &ge_matrix_offset[_ge_pitch * ge_row_k];

                // If the bit was found:
                if (0 != (*rem_row & ge_mask))
                {
                    // Unroll first word to handle masked word and for speed
                    *rem_row ^= row0;

                    // Add the pivot row to eliminate the bit from this row, preserving previous bits
                    for (unsigned ii = 1, end = _ge_pitch - word_offset; ii < end; ++ii) {
                        rem_row[ii] ^= ge_row[ii];
                    }
                }
            } // next remaining row

            break;
        }

        // If pivot could not be found:
        if (!found)
        {
            _next_pivot = pivot_i;

            CAT_IF_DUMP(cout << "Singular: Pivot " << pivot_i << " of " <<
                (_defer_count + _mix_count) << " not found!" << endl;)

            CAT_IF_PIVOT(if (pivot_i + 16 < (unsigned)(_defer_count + _mix_count)) {
                cout << ">>>>> Singular: Pivot " << pivot_i << " of " <<
                    (_defer_count + _mix_count) << " not found!" << endl << endl;
            })

            return false;
        }

        // Generate next mask
        ge_mask = CAT_ROL64(ge_mask, 1);
    }

    _next_pivot = pivot_i;

    InsertHeavyRows();

    return true;
}